

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O3

void __thiscall icu_63::CollationWeights::initForPrimary(CollationWeights *this,UBool compressible)

{
  this->middleLength = 1;
  this->minBytes[1] = 3;
  this->maxBytes[1] = 0xff;
  this->minBytes[2] = (uint)(compressible != '\0') * 2 + 2;
  this->maxBytes[2] = compressible == '\0' | 0xfe;
  this->minBytes[3] = 2;
  this->minBytes[4] = 2;
  this->maxBytes[3] = 0xff;
  this->maxBytes[4] = 0xff;
  return;
}

Assistant:

void
CollationWeights::initForPrimary(UBool compressible) {
    middleLength=1;
    minBytes[1] = Collation::MERGE_SEPARATOR_BYTE + 1;
    maxBytes[1] = Collation::TRAIL_WEIGHT_BYTE;
    if(compressible) {
        minBytes[2] = Collation::PRIMARY_COMPRESSION_LOW_BYTE + 1;
        maxBytes[2] = Collation::PRIMARY_COMPRESSION_HIGH_BYTE - 1;
    } else {
        minBytes[2] = 2;
        maxBytes[2] = 0xff;
    }
    minBytes[3] = 2;
    maxBytes[3] = 0xff;
    minBytes[4] = 2;
    maxBytes[4] = 0xff;
}